

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall
icu_63::CollationFastLatinBuilder::encodeCharCEs
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  UnicodeString *this_00;
  short sVar1;
  long first;
  UChar c;
  int iVar2;
  uint32_t uVar3;
  UnicodeString *this_01;
  long lVar4;
  int iVar5;
  int32_t iVar6;
  bool bVar7;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = &this->result;
    sVar1 = (this->result).fUnion.fStackFields.fLengthAndFlags;
    iVar2 = (this->result).fUnion.fFields.fLength;
    iVar5 = 0x1c0;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      UnicodeString::append(this_00,L'\0');
    }
    iVar5 = (int)(short)((uint)(int)sVar1 >> 5);
    if (sVar1 < 0) {
      iVar5 = iVar2;
    }
    sVar1 = (this->result).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (this->result).fUnion.fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    for (lVar4 = 0x20; lVar4 != 0x1c20; lVar4 = lVar4 + 0x10) {
      first = *(long *)((long)(this->charCEs + -2) + lVar4);
      if (first == 0x101000100 || (int)((ulong)first >> 0x20) != 1) {
        uVar3 = encodeTwoCEs(this,first,*(int64_t *)((long)(this->charCEs + -2) + 8 + lVar4));
        c = (char16_t)uVar3;
        if (0xffff < uVar3) {
          sVar1 = (this->result).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar6 = (this->result).fUnion.fFields.fLength;
          }
          else {
            iVar6 = (int)sVar1 >> 5;
          }
          c = L'\x01';
          if (iVar6 - iVar2 < 0x400) {
            this_01 = UnicodeString::append(this_00,(char16_t)(uVar3 >> 0x10));
            UnicodeString::append(this_01,(char16_t)uVar3);
            c = (ushort)(iVar6 - iVar2) | 0x800;
          }
        }
        UnicodeString::setCharAt(this_00,iVar5,c);
      }
      iVar5 = iVar5 + 1;
    }
    return *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
  }
  return '\0';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }